

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_enc.cpp
# Opt level: O1

int __thiscall basisu::huffman_encoding_table::init(huffman_encoding_table *this,EVP_PKEY_CTX *ctx)

{
  uint uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  uint32_t min_new_capacity;
  undefined2 uVar4;
  uint uVar5;
  ulong uVar6;
  long in_RDX;
  ulong uVar7;
  uint16_vec sym_freq;
  elemental_vector local_48;
  
  min_new_capacity = (uint32_t)ctx;
  uVar5 = 0;
  if (0xffffbfff < min_new_capacity - 0x4001) {
    local_48.m_p = (void *)0x0;
    local_48.m_size = 0;
    local_48.m_capacity = 0;
    if (min_new_capacity != 0) {
      uVar7 = 0;
      elemental_vector::increase_capacity
                (&local_48,min_new_capacity,min_new_capacity == 1,2,(object_mover)0x0,false);
      memset((void *)((local_48._8_8_ & 0xffffffff) * 2 + (long)local_48.m_p),0,
             (ulong)(min_new_capacity - local_48.m_size) * 2);
      local_48.m_size = min_new_capacity;
      uVar5 = 0;
      do {
        uVar1 = *(uint *)(in_RDX + uVar7 * 4);
        if (uVar1 < uVar5) {
          uVar1 = uVar5;
        }
        uVar5 = uVar1;
        uVar7 = uVar7 + 1;
      } while (((ulong)ctx & 0xffffffff) != uVar7);
    }
    if (uVar5 < 0xffff) {
      if (min_new_capacity != 0) {
        uVar7 = 0;
        do {
          if ((local_48._8_8_ & 0xffffffff) <= uVar7) goto LAB_00226868;
          *(undefined2 *)((long)local_48.m_p + uVar7 * 2) = *(undefined2 *)(in_RDX + uVar7 * 4);
          uVar7 = uVar7 + 1;
        } while (((ulong)ctx & 0xffffffff) != uVar7);
      }
    }
    else if (min_new_capacity != 0) {
      uVar7 = 0;
      do {
        uVar6 = (ulong)*(uint *)(in_RDX + uVar7 * 4);
        if (uVar6 != 0) {
          if ((local_48._8_8_ & 0xffffffff) <= uVar7) goto LAB_00226868;
          uVar6 = uVar6 * 0xfffe + (ulong)(uVar5 >> 1);
          auVar2._8_8_ = 0;
          auVar2._0_8_ = CONCAT44(0,uVar5);
          auVar3._8_8_ = 0;
          auVar3._0_8_ = uVar6;
          uVar4 = SUB162(auVar3 / auVar2,0);
          if (0xfffd < SUB164(auVar3 / auVar2,0)) {
            uVar4 = 0xfffe;
          }
          if (uVar6 < CONCAT44(0,uVar5)) {
            uVar4 = 1;
          }
          *(undefined2 *)((long)local_48.m_p + uVar7 * 2) = uVar4;
        }
        uVar7 = uVar7 + 1;
      } while (((ulong)ctx & 0xffffffff) != uVar7);
    }
    if (local_48.m_size == 0) {
LAB_00226868:
      __assert_fail("i < m_size",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/../transcoder/basisu_containers.h"
                    ,0x178,
                    "T &basisu::vector<unsigned short>::operator[](size_t) [T = unsigned short]");
    }
    uVar5 = init(this,(EVP_PKEY_CTX *)((ulong)ctx & 0xffffffff));
    if (local_48.m_p != (void *)0x0) {
      free(local_48.m_p);
    }
  }
  return uVar5;
}

Assistant:

bool huffman_encoding_table::init(uint32_t num_syms, const uint32_t *pSym_freq, uint32_t max_code_size)
	{
		if ((!num_syms) || (num_syms > cHuffmanMaxSyms))
			return false;

		uint16_vec sym_freq(num_syms);

		uint32_t max_freq = 0;
		for (uint32_t i = 0; i < num_syms; i++)
			max_freq = maximum(max_freq, pSym_freq[i]);

		if (max_freq < UINT16_MAX)
		{
			for (uint32_t i = 0; i < num_syms; i++)
				sym_freq[i] = static_cast<uint16_t>(pSym_freq[i]);
		}
		else
		{
			for (uint32_t i = 0; i < num_syms; i++)
			{
				if (pSym_freq[i])
				{
					uint32_t f = static_cast<uint32_t>((static_cast<uint64_t>(pSym_freq[i]) * 65534U + (max_freq >> 1)) / max_freq);
					sym_freq[i] = static_cast<uint16_t>(clamp<uint32_t>(f, 1, 65534));
				}
			}
		}

		return init(num_syms, &sym_freq[0], max_code_size);
	}